

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O0

_Bool aux_terrain(chunk_conflict1 *c,player *p,target_aux_state *auxst)

{
  loc_conflict grid;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  _Bool _Var1;
  char *pcVar2;
  ui_event uVar3;
  _Bool local_18a;
  _Bool local_189;
  char *local_180;
  undefined4 local_170;
  char local_158 [8];
  char out_val [256];
  char *lphrase3;
  char *lphrase2;
  char *name;
  target_aux_state *auxst_local;
  player *p_local;
  chunk_conflict1 *c_local;
  
  if (((auxst->boring & 1U) == 0) &&
     (grid.x = (auxst->grid).x, grid.y = (auxst->grid).y,
     _Var1 = square_isinteresting((chunk *)p->cave,grid), !_Var1)) {
    return false;
  }
  grid_00.x = (auxst->grid).x;
  grid_00.y = (auxst->grid).y;
  pcVar2 = square_apparent_name((chunk *)p->cave,grid_00);
  if (*auxst->phrase2 == '\0') {
    local_180 = "";
  }
  else {
    grid_01.x = (auxst->grid).x;
    grid_01.y = (auxst->grid).y;
    local_180 = square_apparent_look_in_preposition((chunk *)p->cave,grid_01);
  }
  grid_02.x = (auxst->grid).x;
  grid_02.y = (auxst->grid).y;
  out_val._248_8_ = square_apparent_look_prefix((chunk *)p->cave,grid_02);
  if ((p->wizard & 1U) == 0) {
    strnfmt(local_158,0x100,"%s%s%s%s, %s.",auxst->phrase1,local_180,out_val._248_8_,pcVar2,auxst);
  }
  else {
    strnfmt(local_158,0x100,"%s%s%s%s, %s (%d:%d, noise=%d, scent=%d).",auxst->phrase1,local_180,
            out_val._248_8_,pcVar2,auxst,(auxst->grid).y,(auxst->grid).x,
            (uint)(c->noise).grids[(auxst->grid).y][(auxst->grid).x],
            (uint)(c->scent).grids[(auxst->grid).y][(auxst->grid).x]);
  }
  prt(local_158,L'\0',L'\0');
  move_cursor_relative((auxst->grid).y,(auxst->grid).x);
  uVar3 = inkey_m();
  local_170 = CONCAT31(local_170._1_3_,uVar3.key.mods);
  (auxst->press).mouse = uVar3.mouse;
  *(undefined4 *)((long)&auxst->press + 8) = local_170;
  if (((auxst->press).type != EVT_MOUSE) ||
     (local_189 = true, (auxst->press).mouse.button != '\x02')) {
    local_18a = false;
    if (((auxst->press).type != EVT_MOUSE) && (local_18a = false, (auxst->press).key.code != 0x9c))
    {
      local_18a = (auxst->press).key.code != 0x20;
    }
    local_189 = local_18a;
  }
  return local_189;
}

Assistant:

static bool aux_terrain(struct chunk *c, struct player *p,
		struct target_aux_state *auxst)
{
	const char *name, *lphrase2, *lphrase3;
	char out_val[TARGET_OUT_VAL_SIZE];

	if (!auxst->boring && !square_isinteresting(p->cave, auxst->grid))
		return false;

	/* Terrain feature if needed */
	name = square_apparent_name(p->cave, auxst->grid);

	/* Hack -- handle unknown grids */

	/* Pick a preposition if needed */
	lphrase2 = (*auxst->phrase2) ?
		square_apparent_look_in_preposition(p->cave, auxst->grid) : "";

	/* Pick prefix for the name */
	lphrase3 = square_apparent_look_prefix(p->cave, auxst->grid);

	/* Display a message */
	if (p->wizard) {
		strnfmt(out_val, sizeof(out_val),
			"%s%s%s%s, %s (%d:%d, noise=%d, scent=%d).",
			auxst->phrase1,
			lphrase2,
			lphrase3,
			name,
			auxst->coord_desc,
			auxst->grid.y,
			auxst->grid.x,
			(int)c->noise.grids[auxst->grid.y][auxst->grid.x],
			(int)c->scent.grids[auxst->grid.y][auxst->grid.x]);
	} else {
		strnfmt(out_val, sizeof(out_val),
			"%s%s%s%s, %s.",
			auxst->phrase1,
			lphrase2,
			lphrase3,
			name,
			auxst->coord_desc);
	}

	prt(out_val, 0, 0);
	move_cursor_relative(auxst->grid.y, auxst->grid.x);
	auxst->press = inkey_m();

	/*
	 * Stop on right click of mouse or everything but "return"/"space" for
	 * a key.
	 */
	return (auxst->press.type == EVT_MOUSE
			&& auxst->press.mouse.button == 2)
		|| (auxst->press.type != EVT_MOUSE
			&& auxst->press.key.code != KC_ENTER
			&& auxst->press.key.code != ' ');
}